

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesCordSemantics_Test::
TestBody(CppMetadataTest_AnnotatesCordSemantics_Test *this)

{
  allocator<int> *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  initializer_list<int> __l;
  string_view data;
  bool bVar2;
  char *message;
  DescriptorProto *this_01;
  Annotation *annotation_00;
  reference pvVar3;
  reference ppGVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  char *expected_predicate_value;
  undefined1 auVar6 [16];
  string_view file_content;
  string_view file_content_00;
  AssertHelper local_688;
  Message local_680;
  undefined1 local_678 [8];
  undefined1 local_670 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_640;
  Message local_638;
  undefined1 local_630 [8];
  undefined1 local_628 [8];
  AssertionResult gtest_ar_5;
  basic_string_view<char,_std::char_traits<char>_> local_5f8;
  size_t local_5e8;
  char *local_5e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_5d8;
  size_t local_5c8;
  char *local_5c0;
  AssertHelper local_5b8;
  Message local_5b0;
  undefined1 local_5a8 [8];
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_4;
  string local_570;
  AssertHelper local_550;
  Message local_548;
  bool local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_518 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> substring_1;
  GeneratedCodeInfo_Annotation *annotation_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  *__range3_1;
  AssertHelper local_4c0;
  Message local_4b8;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__3;
  string local_490;
  AssertHelper local_470;
  Message local_468;
  undefined1 local_460 [8];
  undefined1 local_458 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_428;
  Message local_420;
  undefined1 local_418 [8];
  undefined1 local_410 [8];
  AssertionResult gtest_ar_2;
  basic_string_view<char,_std::char_traits<char>_> local_3e0;
  size_t local_3d0;
  char *local_3c8;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_1;
  string local_370;
  AssertHelper local_350;
  Message local_348;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_318 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> substring;
  GeneratedCodeInfo_Annotation *annotation;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  *__range3;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__1;
  string local_290;
  undefined1 local_270 [8];
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  int local_250 [4];
  iterator local_240;
  size_type local_238;
  undefined1 local_230 [8];
  vector<int,_std::allocator<int>_> field_path;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1d8;
  Message local_1d0;
  allocator<char> local_1c1;
  string local_1c0;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_;
  string_view local_178;
  undefined1 local_168 [8];
  string pb_h;
  undefined1 local_138 [8];
  GeneratedCodeInfo info;
  FileDescriptorProto file;
  CppMetadataTest_AnnotatesCordSemantics_Test *this_local;
  
  FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)&info.field_0._impl_._cached_size_);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_138);
  std::__cxx11::string::string((string *)local_168);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,"test.proto");
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0xa8;
  data._M_str = (char *)0x1e40a58;
  data._M_len = 0xa8;
  annotation_test_util::AddFile(local_178,data);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"test.proto",&local_1c1);
  expected_predicate_value = (char *)0x0;
  local_199 = CppMetadataTest::CaptureMetadata
                        (&this->super_CppMetadataTest,&local_1c0,
                         (FileDescriptorProto *)&info.field_0._impl_._cached_size_,
                         (string *)local_168,(GeneratedCodeInfo *)local_138,(string *)0x0,
                         (GeneratedCodeInfo *)0x0,(string *)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_198,
               (AssertionResult *)
               "CaptureMetadata(\"test.proto\", &file, &pb_h, &info, nullptr, nullptr, nullptr)",
               "false","true",expected_predicate_value);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x13d,message);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  this_01 = FileDescriptorProto::message_type
                      ((FileDescriptorProto *)&info.field_0._impl_._cached_size_,0);
  annotation_00 = (Annotation *)DescriptorProto::name_abi_cxx11_(this_01);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_208,"\"Message\"","file.message_type(0).name()",
             (char (*) [8])0x1ddb4a9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)annotation_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    annotation_00 =
         (Annotation *)testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &field_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x13e,(char *)annotation_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &field_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_210);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &field_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_250[0] = 4;
  local_250[1] = 0;
  local_250[2] = 2;
  local_250[3] = 0;
  local_240 = local_250;
  local_238 = 4;
  this_00 = (allocator<int> *)
            ((long)&annotations.
                    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_238;
  __l._M_array = local_240;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_230,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&annotations.
                     super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::vector((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"test.proto",
             (allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)local_138,&local_290,
             (vector<int,_std::allocator<int>_> *)local_230,
             (vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              *)local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_2a9 = std::
              vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ::empty((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                       *)local_270);
  local_2a9 = !local_2a9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&__range3,(internal *)local_2a8,(AssertionResult *)"!annotations.empty()",
               "false","true",expected_predicate_value);
    annotation_00 = (Annotation *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x143,(char *)annotation_00);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&__range3);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  __end3 = std::
           vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
           ::begin((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    *)local_270);
  annotation = (GeneratedCodeInfo_Annotation *)
               std::
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ::end((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                      *)local_270);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_**,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
                                     *)&annotation), bVar2) {
    ppGVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_**,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
              ::operator*(&__end3);
    substring.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _16_8_ = *ppGVar4;
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_168);
    file_content._M_len = auVar6._8_8_;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = auVar6._0_8_;
    file_content._M_str =
         (char *)substring.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._16_8_;
    annotation_test_util::GetAnnotationSubstring
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_318,
               (annotation_test_util *)
               gtest_ar__2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,file_content,annotation_00);
    local_339 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                          ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           local_318);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_338,&local_339,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
    if (!bVar2) {
      testing::Message::Message(&local_348);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_370,(internal *)local_338,(AssertionResult *)"substring.has_value()","false"
                 ,"true",expected_predicate_value);
      annotation_00 = (Annotation *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x146,(char *)annotation_00);
      testing::internal::AssertHelper::operator=(&local_350,&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
    if (!bVar2) goto LAB_00eda2be;
    pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        local_318);
    bVar1 = *pbVar5;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_1.message_,"sfield");
    bVar2 = std::operator==(bVar1,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                  stack0xfffffffffffffc68);
    if (bVar2) {
      local_3b0._4_4_ = 0;
      local_3b0._0_4_ =
           GeneratedCodeInfo_Annotation::semantic
                     ((GeneratedCodeInfo_Annotation *)
                      substring.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._16_8_);
      annotation_00 = (Annotation *)local_3b0;
      testing::internal::EqHelper::
      Compare<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_nullptr>
                ((EqHelper *)local_3a8,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                 "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)(local_3b0 + 4),
                 (GeneratedCodeInfo_Annotation_Semantic *)annotation_00);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
      if (!bVar2) {
        testing::Message::Message(&local_3b8);
        annotation_00 =
             (Annotation *)testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x149,(char *)annotation_00);
        testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
        testing::Message::~Message(&local_3b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    }
    else {
      pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                         ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          local_318);
      local_3d0 = pbVar5->_M_len;
      local_3c8 = pbVar5->_M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3e0,"set_sfield");
      __x_00._M_str = local_3c8;
      __x_00._M_len = local_3d0;
      bVar2 = std::operator==(__x_00,local_3e0);
      if (!bVar2) {
        pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                           ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_318);
        bVar1 = *pbVar5;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_2.message_,
                   "clear_sfield");
        bVar2 = std::operator==(bVar1,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                       )stack0xfffffffffffffc00);
        if (!bVar2) {
          pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                             ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_318);
          bVar1 = *pbVar5;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_3.message_,
                     "mutable_sfield");
          bVar2 = std::operator==(bVar1,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                         )stack0xfffffffffffffbb8);
          if (bVar2) {
            local_460._4_4_ = 2;
            local_460._0_4_ =
                 GeneratedCodeInfo_Annotation::semantic
                           ((GeneratedCodeInfo_Annotation *)
                            substring.
                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ._16_8_);
            annotation_00 = (Annotation *)local_460;
            testing::internal::EqHelper::
            Compare<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_nullptr>
                      ((EqHelper *)local_458,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                       "annotation->semantic()",
                       (GeneratedCodeInfo_Annotation_Semantic *)(local_460 + 4),
                       (GeneratedCodeInfo_Annotation_Semantic *)annotation_00);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
            if (!bVar2) {
              testing::Message::Message(&local_468);
              annotation_00 =
                   (Annotation *)
                   testing::AssertionResult::failure_message((AssertionResult *)local_458);
              testing::internal::AssertHelper::AssertHelper
                        (&local_470,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                         ,0x14f,(char *)annotation_00);
              testing::internal::AssertHelper::operator=(&local_470,&local_468);
              testing::internal::AssertHelper::~AssertHelper(&local_470);
              testing::Message::~Message(&local_468);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
          }
          goto LAB_00ed982a;
        }
      }
      local_418._4_4_ = 1;
      local_418._0_4_ =
           GeneratedCodeInfo_Annotation::semantic
                     ((GeneratedCodeInfo_Annotation *)
                      substring.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._16_8_);
      annotation_00 = (Annotation *)local_418;
      testing::internal::EqHelper::
      Compare<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_nullptr>
                ((EqHelper *)local_410,"GeneratedCodeInfo_Annotation_Semantic_SET",
                 "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)(local_418 + 4),
                 (GeneratedCodeInfo_Annotation_Semantic *)annotation_00);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
      if (!bVar2) {
        testing::Message::Message(&local_420);
        annotation_00 =
             (Annotation *)testing::AssertionResult::failure_message((AssertionResult *)local_410);
        testing::internal::AssertHelper::AssertHelper
                  (&local_428,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x14c,(char *)annotation_00);
        testing::internal::AssertHelper::operator=(&local_428,&local_420);
        testing::internal::AssertHelper::~AssertHelper(&local_428);
        testing::Message::~Message(&local_420);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    }
LAB_00ed982a:
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_**,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
    ::operator++(&__end3);
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)local_230);
  *pvVar3 = 1;
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::clear((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
           *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"test.proto",
             (allocator<char> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)local_138,&local_490,
             (vector<int,_std::allocator<int>_> *)local_230,
             (vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              *)local_270);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_4a9 = std::
              vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ::empty((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                       *)local_270);
  local_4a9 = !local_4a9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&__range3_1,(internal *)local_4a8,(AssertionResult *)"!annotations.empty()"
               ,"false","true",expected_predicate_value);
    annotation_00 = (Annotation *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x155,(char *)annotation_00);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    std::__cxx11::string::~string((string *)&__range3_1);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  __end3_1 = std::
             vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
             ::begin((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                      *)local_270);
  annotation_1 = (GeneratedCodeInfo_Annotation *)
                 std::
                 vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ::end((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                        *)local_270);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_**,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
                             *)&annotation_1), bVar2) {
    ppGVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_**,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
              ::operator*(&__end3_1);
    substring_1.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _16_8_ = *ppGVar4;
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_168);
    file_content_00._M_len = auVar6._8_8_;
    gtest_ar__4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = auVar6._0_8_;
    file_content_00._M_str =
         (char *)substring_1.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._16_8_;
    annotation_test_util::GetAnnotationSubstring
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_518,
               (annotation_test_util *)
               gtest_ar__4.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,file_content_00,annotation_00);
    local_539 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                          ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           local_518);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_538,&local_539,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
    if (!bVar2) {
      testing::Message::Message(&local_548);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_570,(internal *)local_538,(AssertionResult *)"substring.has_value()","false"
                 ,"true",expected_predicate_value);
      annotation_00 = (Annotation *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_550,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x158,(char *)annotation_00);
      testing::internal::AssertHelper::operator=(&local_550,&local_548);
      testing::internal::AssertHelper::~AssertHelper(&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      testing::Message::~Message(&local_548);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
    if (!bVar2) break;
    pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        local_518);
    bVar1 = *pbVar5;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_4.message_,"rsfield");
    bVar2 = std::operator==(bVar1,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                  stack0xfffffffffffffa70);
    if (bVar2) {
      local_5a8._4_4_ = 0;
      local_5a8._0_4_ =
           GeneratedCodeInfo_Annotation::semantic
                     ((GeneratedCodeInfo_Annotation *)
                      substring_1.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._16_8_);
      annotation_00 = (Annotation *)local_5a8;
      testing::internal::EqHelper::
      Compare<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_nullptr>
                ((EqHelper *)local_5a0,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                 "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)(local_5a8 + 4),
                 (GeneratedCodeInfo_Annotation_Semantic *)annotation_00);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
      if (!bVar2) {
        testing::Message::Message(&local_5b0);
        annotation_00 =
             (Annotation *)testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x15b,(char *)annotation_00);
        testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
        testing::internal::AssertHelper::~AssertHelper(&local_5b8);
        testing::Message::~Message(&local_5b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
    }
    else {
      pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                         ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          local_518);
      local_5c8 = pbVar5->_M_len;
      local_5c0 = pbVar5->_M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_5d8,"set_rsfield");
      bVar1._M_str = local_5c0;
      bVar1._M_len = local_5c8;
      bVar2 = std::operator==(bVar1,local_5d8);
      if (!bVar2) {
        pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                           ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_518);
        local_5e8 = pbVar5->_M_len;
        local_5e0 = pbVar5->_M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_5f8,"clear_rsfield");
        __x._M_str = local_5e0;
        __x._M_len = local_5e8;
        bVar2 = std::operator==(__x,local_5f8);
        if (!bVar2) {
          pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                             ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_518);
          bVar1 = *pbVar5;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_5.message_,
                     "add_rsfield");
          bVar2 = std::operator==(bVar1,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                         )stack0xfffffffffffff9e8);
          if (!bVar2) {
            pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator*((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               local_518);
            bVar1 = *pbVar5;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_6.message_,
                       "mutable_rsfield");
            bVar2 = std::operator==(bVar1,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                           )stack0xfffffffffffff9a0);
            if (bVar2) {
              local_678._4_4_ = 2;
              local_678._0_4_ =
                   GeneratedCodeInfo_Annotation::semantic
                             ((GeneratedCodeInfo_Annotation *)
                              substring_1.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._16_8_);
              annotation_00 = (Annotation *)local_678;
              testing::internal::EqHelper::
              Compare<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_nullptr>
                        ((EqHelper *)local_670,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                         "annotation->semantic()",
                         (GeneratedCodeInfo_Annotation_Semantic *)(local_678 + 4),
                         (GeneratedCodeInfo_Annotation_Semantic *)annotation_00);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
              if (!bVar2) {
                testing::Message::Message(&local_680);
                annotation_00 =
                     (Annotation *)
                     testing::AssertionResult::failure_message((AssertionResult *)local_670);
                testing::internal::AssertHelper::AssertHelper
                          (&local_688,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                           ,0x162,(char *)annotation_00);
                testing::internal::AssertHelper::operator=(&local_688,&local_680);
                testing::internal::AssertHelper::~AssertHelper(&local_688);
                testing::Message::~Message(&local_680);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
            }
            goto LAB_00eda2a1;
          }
        }
      }
      local_630._4_4_ = 1;
      local_630._0_4_ =
           GeneratedCodeInfo_Annotation::semantic
                     ((GeneratedCodeInfo_Annotation *)
                      substring_1.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._16_8_);
      annotation_00 = (Annotation *)local_630;
      testing::internal::EqHelper::
      Compare<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_nullptr>
                ((EqHelper *)local_628,"GeneratedCodeInfo_Annotation_Semantic_SET",
                 "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)(local_630 + 4),
                 (GeneratedCodeInfo_Annotation_Semantic *)annotation_00);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
      if (!bVar2) {
        testing::Message::Message(&local_638);
        annotation_00 =
             (Annotation *)testing::AssertionResult::failure_message((AssertionResult *)local_628);
        testing::internal::AssertHelper::AssertHelper
                  (&local_640,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x15f,(char *)annotation_00);
        testing::internal::AssertHelper::operator=(&local_640,&local_638);
        testing::internal::AssertHelper::~AssertHelper(&local_640);
        testing::Message::~Message(&local_638);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
    }
LAB_00eda2a1:
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_**,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
    ::operator++(&__end3_1);
  }
LAB_00eda2be:
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::~vector((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
             *)local_270);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_230);
  std::__cxx11::string::~string((string *)local_168);
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_138);
  FileDescriptorProto::~FileDescriptorProto
            ((FileDescriptorProto *)&info.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesCordSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kCordFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_sfield" || *substring == "clear_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
  field_path.back() = 1;
  annotations.clear();
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_rsfield" || *substring == "clear_rsfield" ||
               *substring == "add_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}